

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

BinInputStream * __thiscall xercesc_4_0::XMLURL::makeNewStream(XMLURL *this)

{
  ulong fromIndex;
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  XMLCh *__src;
  int iVar4;
  BinInputStream *pBVar5;
  XMLCh *toDelete;
  long lVar6;
  BinFileInputStream *this_00;
  MalformedURLException *pMVar7;
  ulong uVar8;
  ulong uVar9;
  short sVar10;
  short sVar11;
  size_t __n;
  XMLCh value1 [4];
  ArrayJanitor<char16_t> basePathName;
  XMLCh local_48;
  undefined2 uStack_46;
  XMLCh local_44;
  undefined2 local_42;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var;
  
  if ((this->fProtocol != File) ||
     ((this->fHost != (XMLCh *)0x0 &&
      (iVar4 = XMLString::compareIStringASCII(this->fHost,(XMLCh *)XMLUni::fgLocalHostString),
      iVar4 != 0)))) {
    if (XMLPlatformUtils::fgNetAccessor == (long *)0x0) {
      pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x29f,URL_UnsupportedProto,this->fMemoryManager);
      __cxa_throw(pMVar7,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    pBVar5 = (BinInputStream *)
             (**(code **)(*XMLPlatformUtils::fgNetAccessor + 0x18))
                       (XMLPlatformUtils::fgNetAccessor,this,0);
    return pBVar5;
  }
  __src = this->fPath;
  if (__src == (XMLCh *)0x0) {
    toDelete = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)__src + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    toDelete = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memcpy(toDelete,__src,__n);
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
  uVar8 = 0;
  if (toDelete != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toDelete + uVar8);
      uVar8 = uVar8 + 2;
    } while (*psVar1 != 0);
    uVar8 = ((long)uVar8 >> 1) - 1;
  }
  iVar4 = XMLString::indexOf(toDelete,L'%',0,this->fMemoryManager);
  while( true ) {
    if (iVar4 == -1) {
      this_00 = (BinFileInputStream *)XMemory::operator_new(0x18,this->fMemoryManager);
      BinFileInputStream::BinFileInputStream(this_00,toDelete,this->fMemoryManager);
      if (this_00->fSource == (FileHandle)0x0) {
        (*(this_00->super_BinInputStream)._vptr_BinInputStream[1])(this_00);
        this_00 = (BinFileInputStream *)0x0;
      }
      ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
      return &this_00->super_BinInputStream;
    }
    lVar6 = (long)iVar4;
    if ((int)uVar8 <= iVar4 + 2) {
      uStack_46 = 0;
      local_44 = 0;
      memmove(&local_48,toDelete + lVar6,(ulong)(iVar4 + 1 < (int)uVar8) * 2 + 2);
      pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x271,XMLNUM_URI_Component_Invalid_EscapeSequence,toDelete,&local_48,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      __cxa_throw(pMVar7,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    XVar2 = toDelete[lVar6 + 1];
    if ((9 < (ushort)(XVar2 + L'￐')) &&
       ((0x25 < (ushort)XVar2 - 0x41 ||
        ((0x3f0000003fU >> ((ulong)((ushort)XVar2 - 0x41) & 0x3f) & 1) == 0)))) break;
    XVar3 = toDelete[iVar4 + 2];
    if ((9 < (ushort)(XVar3 + L'￐')) &&
       ((0x25 < (ushort)XVar3 - 0x41 ||
        ((0x3f0000003fU >> ((ulong)((ushort)XVar3 - 0x41) & 0x3f) & 1) == 0)))) break;
    fromIndex = lVar6 + 1;
    sVar11 = (ushort)((ushort)(XVar2 + L'﾿') < 6) * 0x20 + 0xfa9;
    if ((ushort)(XVar2 + L'￐') < 10) {
      sVar11 = 0xfd0;
    }
    sVar10 = (ushort)((ushort)(XVar3 + L'﾿') < 6) * 0x20 + -0x57;
    if ((ushort)(XVar3 + L'￐') < 10) {
      sVar10 = -0x30;
    }
    toDelete[lVar6] = sVar10 + XVar3 + (sVar11 + XVar2) * 0x10;
    uVar9 = uVar8 - 2;
    uVar8 = fromIndex;
    if (fromIndex < uVar9) {
      do {
        toDelete[uVar8] = toDelete[uVar8 + 2];
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    toDelete[uVar8] = L'\0';
    iVar4 = -1;
    if (fromIndex < uVar8) {
      iVar4 = XMLString::indexOf(toDelete,L'%',fromIndex,this->fMemoryManager);
    }
  }
  local_44 = toDelete[lVar6 + 2];
  local_48 = (XMLCh)*(undefined4 *)(toDelete + lVar6);
  uStack_46 = (undefined2)((uint)*(undefined4 *)(toDelete + lVar6) >> 0x10);
  local_42 = 0;
  pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
  MalformedURLException::MalformedURLException
            (pMVar7,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
             ,0x27c,XMLNUM_URI_Component_Invalid_EscapeSequence,toDelete,&local_48,(XMLCh *)0x0,
             (XMLCh *)0x0,this->fMemoryManager);
  __cxa_throw(pMVar7,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

BinInputStream* XMLURL::makeNewStream() const
{
    //
    //  If its a local host, then we short circuit it and use our own file
    //  stream support. Otherwise, we just let it fall through and let the
    //  installed network access object provide a stream.
    //
    if (fProtocol == XMLURL::File)
    {
        if (!fHost || !XMLString::compareIStringASCII(fHost, XMLUni::fgLocalHostString))
        {

            XMLCh* realPath = XMLString::replicate(fPath, fMemoryManager);
            ArrayJanitor<XMLCh> basePathName(realPath, fMemoryManager);

            //
            // Need to manually replace any character reference %xx first
            // HTTP protocol will be done automatically by the netaccessor
            //
            XMLSize_t end = XMLString::stringLen(realPath);
            int percentIndex = XMLString::indexOf(realPath, chPercent, 0, fMemoryManager);

            while (percentIndex != -1) {

            	// Isolate the length/boundary check so we don't try and copy off the end.
                if (percentIndex+2 >= (int)end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
					XMLString::moveChars(value1, &(realPath[percentIndex]), (percentIndex + 1 >= (int)end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }
                else if (!isHexDigit(realPath[percentIndex+1]) || !isHexDigit(realPath[percentIndex+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(realPath[percentIndex]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }

                unsigned int value = (xlatHexDigit(realPath[percentIndex+1]) * 16) + xlatHexDigit(realPath[percentIndex+2]);

                realPath[percentIndex] = XMLCh(value);

                XMLSize_t i =0;
                for (i = percentIndex + 1; i < end - 2 ; i++)
                    realPath[i] = realPath[i+2];
                realPath[i] = chNull;
                end = i;

                if (((XMLSize_t)(percentIndex + 1)) < end)
                  percentIndex = XMLString::indexOf(realPath, chPercent, percentIndex + 1, fMemoryManager);
                else
                  percentIndex = -1;
            }


            BinFileInputStream* retStrm = new (fMemoryManager) BinFileInputStream(realPath, fMemoryManager);
            if (!retStrm->getIsOpen())
            {
                delete retStrm;
                return 0;
            }
            return retStrm;
        }
    }

    //
    //  If we don't have have an installed net accessor object, then we
    //  have to just throw here.
    //
    if (!XMLPlatformUtils::fgNetAccessor)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_UnsupportedProto, fMemoryManager);

    // Else ask the net accessor to create the stream
    return XMLPlatformUtils::fgNetAccessor->makeNew(*this);
}